

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O1

_Bool map_loop(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *closure;
  gravity_object_t *pgVar1;
  _Bool _Var2;
  uint32_t n;
  gravity_fiber_t *fiber;
  gravity_object_t *obj;
  nanotime_t nVar3;
  nanotime_t nVar4;
  long lVar5;
  gravity_value_t value;
  gravity_value_t gVar6;
  char _buffer [4096];
  char local_1038 [4];
  char acStack_1034 [4];
  char acStack_1030 [4];
  char acStack_102c [4];
  undefined4 uStack_1028;
  undefined3 uStack_1024;
  undefined5 uStack_1021;
  undefined3 uStack_101c;
  
  if (nargs < 2) {
    uStack_1028 = 0x20666f20;
    uStack_1024 = 0x677261;
    uStack_1021 = 0x746e656d75;
    uStack_101c = 0x2e73;
    local_1038[0] = 'I';
    local_1038[1] = 'n';
    local_1038[2] = 'c';
    local_1038[3] = 'o';
    acStack_1034[0] = 'r';
    acStack_1034[1] = 'r';
    acStack_1034[2] = 'e';
    acStack_1034[3] = 'c';
    acStack_1030[0] = 't';
    acStack_1030[1] = ' ';
    acStack_1030[2] = 'n';
    acStack_1030[3] = 'u';
    acStack_102c[0] = 'm';
    acStack_102c[1] = 'b';
    acStack_102c[2] = 'e';
    acStack_102c[3] = 'r';
  }
  else {
    if (args[1].isa == gravity_class_closure) {
      closure = args[1].field_1.p;
      pgVar1 = (args->field_1).p;
      gVar6 = *args;
      n = gravity_hash_count((gravity_hash_t *)pgVar1->objclass);
      obj = (gravity_object_t *)gravity_list_new((gravity_vm *)0x0,n);
      gravity_hash_iterate((gravity_hash_t *)pgVar1->objclass,map_keys_array,obj);
      nVar3 = nanotime();
      if (n != 0) {
        lVar5 = 0;
        do {
          _Var2 = gravity_vm_runclosure
                            (vm,(gravity_closure_t *)closure,gVar6,
                             (gravity_value_t *)(*(long *)&obj->has_outer + lVar5),1);
          if (!_Var2) {
            return false;
          }
          lVar5 = lVar5 + 0x10;
        } while ((ulong)n << 4 != lVar5);
      }
      nVar4 = nanotime();
      gravity_vm_transfer(vm,obj);
      gVar6.field_1.p = (gravity_object_t *)(nVar4 - nVar3);
      gVar6.isa = gravity_class_int;
      gravity_vm_setslot(vm,gVar6,rindex);
      return true;
    }
    uStack_1028 = 0x43206120;
    uStack_1024 = 0x736f6c;
    uStack_1021 = 0x2e657275;
    local_1038[0] = 'A';
    local_1038[1] = 'r';
    local_1038[2] = 'g';
    local_1038[3] = 'u';
    acStack_1034[0] = 'm';
    acStack_1034[1] = 'e';
    acStack_1034[2] = 'n';
    acStack_1034[3] = 't';
    acStack_1030[0] = ' ';
    acStack_1030[1] = 'm';
    acStack_1030[2] = 'u';
    acStack_1030[3] = 's';
    acStack_102c[0] = 't';
    acStack_102c[1] = ' ';
    acStack_102c[2] = 'b';
    acStack_102c[3] = 'e';
  }
  fiber = gravity_vm_fiber(vm);
  gravity_fiber_seterror(fiber,local_1038);
  value.field_1.n = 0;
  value.isa = gravity_class_null;
  gravity_vm_setslot(vm,value,rindex);
  return false;
}

Assistant:

static bool map_loop (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (nargs < 2) RETURN_ERROR("Incorrect number of arguments.");
    if (!VALUE_ISA_CLOSURE(GET_VALUE(1))) RETURN_ERROR("Argument must be a Closure.");

    gravity_closure_t *closure = VALUE_AS_CLOSURE(GET_VALUE(1));    // closure to execute
    gravity_value_t value = GET_VALUE(0);                            // self parameter
    gravity_map_t *map = VALUE_AS_MAP(GET_VALUE(0));
    register gravity_int_t n = gravity_hash_count(map->hash);        // times to execute the loop
    register gravity_int_t i = 0;

    // build keys array
    // do not transfer newlist to GC because it could be freed during closure execution
    gravity_list_t *list = gravity_list_new(NULL, (uint32_t)n);
    gravity_hash_iterate(map->hash, map_keys_array, (void *)list);

    nanotime_t t1 = nanotime();
    while (i < n) {
        if (!gravity_vm_runclosure(vm, closure, value, &marray_get(list->array, i), 1)) return false;
        ++i;
    }
    nanotime_t t2 = nanotime();
    
    gravity_vm_transfer(vm, (gravity_object_t*) list);
    RETURN_VALUE(VALUE_FROM_INT(t2-t1), rindex);
}